

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  Curl_addrinfo *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Curl_addrinfo *pCVar5;
  addrinfo *paVar6;
  char *__dest_00;
  size_t __n;
  Curl_addrinfo *pCVar7;
  addrinfo *aihead;
  Curl_addrinfo *local_48;
  addrinfo *local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar3 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_38);
  if (iVar3 == 0) {
    if (local_38 == (addrinfo *)0x0) {
      local_48 = (Curl_addrinfo *)0x0;
    }
    else {
      local_48 = (Curl_addrinfo *)0x0;
      paVar6 = local_38;
      pCVar7 = (Curl_addrinfo *)0x0;
      do {
        if (paVar6->ai_canonname == (char *)0x0) {
          sVar4 = 0;
        }
        else {
          sVar4 = strlen(paVar6->ai_canonname);
          sVar4 = sVar4 + 1;
        }
        pCVar5 = pCVar7;
        if (paVar6->ai_family == 2) {
          __n = 0x10;
LAB_006438c4:
          if ((paVar6->ai_addr == (sockaddr *)0x0) || (paVar6->ai_addrlen < (uint)__n))
          goto LAB_006438d4;
          pCVar5 = (Curl_addrinfo *)(*Curl_cmalloc)(sVar4 + __n + 0x30);
          if (pCVar5 != (Curl_addrinfo *)0x0) {
            iVar3 = paVar6->ai_family;
            iVar1 = paVar6->ai_socktype;
            iVar2 = paVar6->ai_protocol;
            pCVar5->ai_flags = paVar6->ai_flags;
            pCVar5->ai_family = iVar3;
            pCVar5->ai_socktype = iVar1;
            pCVar5->ai_protocol = iVar2;
            pCVar5->ai_addrlen = (uint)__n;
            __dest = pCVar5 + 1;
            pCVar5->ai_canonname = (char *)0x0;
            pCVar5->ai_addr = (sockaddr *)0x0;
            pCVar5->ai_next = (Curl_addrinfo *)0x0;
            pCVar5->ai_addr = (sockaddr *)__dest;
            memcpy(__dest,paVar6->ai_addr,__n);
            if (sVar4 != 0) {
              __dest_00 = (char *)((long)&__dest->ai_flags + __n);
              pCVar5->ai_canonname = __dest_00;
              memcpy(__dest_00,paVar6->ai_canonname,sVar4);
            }
            if (local_48 == (Curl_addrinfo *)0x0) {
              local_48 = pCVar5;
            }
            if (pCVar7 != (Curl_addrinfo *)0x0) {
              pCVar7->ai_next = pCVar5;
            }
            goto LAB_006438d4;
          }
          if (local_38 != (addrinfo *)0x0) {
            freeaddrinfo(local_38);
          }
          iVar3 = -10;
          while (local_48 != (Curl_addrinfo *)0x0) {
            pCVar7 = local_48->ai_next;
            (*Curl_cfree)(local_48);
            local_48 = pCVar7;
          }
          local_48 = (Curl_addrinfo *)0x0;
          goto LAB_0064399d;
        }
        if (paVar6->ai_family == 10) {
          __n = 0x1c;
          goto LAB_006438c4;
        }
LAB_006438d4:
        paVar6 = paVar6->ai_next;
        pCVar7 = pCVar5;
      } while (paVar6 != (addrinfo *)0x0);
      if (local_38 != (addrinfo *)0x0) {
        freeaddrinfo(local_38);
      }
    }
    iVar3 = (uint)(local_48 != (Curl_addrinfo *)0x0) * 2 + -2;
LAB_0064399d:
    *result = local_48;
  }
  return iVar3;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    struct Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  struct Curl_addrinfo *cafirst = NULL;
  struct Curl_addrinfo *calast = NULL;
  struct Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {
    size_t namelen = ai->ai_canonname ? strlen(ai->ai_canonname) + 1 : 0;
    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if(!ai->ai_addr || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(namelen) {
      ca->ai_canonname = (void *)((char *)ca->ai_addr + ss_size);
      memcpy(ca->ai_canonname, ai->ai_canonname, namelen);
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}